

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

void duckdb::ListRangeFunction<duckdb::NumericRangeInfo,false>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  bool bVar3;
  reference pvVar4;
  uint64_t uVar5;
  Vector *pVVar6;
  TYPE TVar7;
  INCREMENT_TYPE IVar8;
  long lVar9;
  idx_t i_1;
  idx_t iVar10;
  long lVar11;
  uint64_t *puVar12;
  idx_t i_2;
  idx_t iVar13;
  idx_t i;
  ulong uVar14;
  idx_t required_capacity;
  VectorType local_134;
  RangeInfoStruct<duckdb::NumericRangeInfo,_false> info;
  
  RangeInfoStruct<duckdb::NumericRangeInfo,_false>::RangeInfoStruct(&info,args);
  uVar14 = 0;
  iVar13 = 1;
  do {
    if ((ulong)(((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x68) <= uVar14) {
      local_134 = CONSTANT_VECTOR;
      goto LAB_01e0e20d;
    }
    pvVar4 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar14);
    uVar14 = uVar14 + 1;
  } while (pvVar4->vector_type == CONSTANT_VECTOR);
  iVar13 = args->count;
  local_134 = FLAT_VECTOR;
LAB_01e0e20d:
  pdVar1 = result->data;
  FlatVector::VerifyFlatVector(result);
  puVar12 = (uint64_t *)(pdVar1 + 8);
  required_capacity = 0;
  for (iVar10 = 0; iVar13 != iVar10; iVar10 = iVar10 + 1) {
    bVar3 = RangeInfoStruct<duckdb::NumericRangeInfo,_false>::RowIsValid(&info,iVar10);
    if (bVar3) {
      puVar12[-1] = required_capacity;
      uVar5 = RangeInfoStruct<duckdb::NumericRangeInfo,_false>::ListLength(&info,iVar10);
      *puVar12 = uVar5;
      required_capacity = required_capacity + uVar5;
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar10);
      puVar12[-1] = required_capacity;
      *puVar12 = 0;
    }
    puVar12 = puVar12 + 2;
  }
  ListVector::Reserve(result,required_capacity);
  pVVar6 = ListVector::GetEntry(result);
  pdVar2 = pVVar6->data;
  lVar9 = 0;
  for (iVar10 = 0; iVar10 != iVar13; iVar10 = iVar10 + 1) {
    TVar7 = RangeInfoStruct<duckdb::NumericRangeInfo,_false>::StartListValue(&info,iVar10);
    IVar8 = RangeInfoStruct<duckdb::NumericRangeInfo,_false>::ListIncrementValue(&info,iVar10);
    for (uVar14 = 0; uVar14 < *(ulong *)(pdVar1 + iVar10 * 0x10 + 8); uVar14 = uVar14 + 1) {
      lVar11 = IVar8;
      if (uVar14 == 0) {
        lVar11 = 0;
      }
      TVar7 = TVar7 + lVar11;
      *(TYPE *)(pdVar2 + uVar14 * 8 + lVar9 * 8) = TVar7;
    }
    lVar9 = lVar9 + uVar14;
  }
  ListVector::SetListSize(result,required_capacity);
  Vector::SetVectorType(result,local_134);
  Vector::Verify(result,args->count);
  RangeInfoStruct<duckdb::NumericRangeInfo,_false>::~RangeInfoStruct(&info);
  return;
}

Assistant:

static void ListRangeFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);

	RangeInfoStruct<OP, INCLUSIVE_BOUND> info(args);
	idx_t args_size = 1;
	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		if (args.data[i].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			args_size = args.size();
			result_type = VectorType::FLAT_VECTOR;
			break;
		}
	}
	auto list_data = FlatVector::GetData<list_entry_t>(result);
	auto &result_validity = FlatVector::Validity(result);
	uint64_t total_size = 0;
	for (idx_t i = 0; i < args_size; i++) {
		if (!info.RowIsValid(i)) {
			result_validity.SetInvalid(i);
			list_data[i].offset = total_size;
			list_data[i].length = 0;
		} else {
			list_data[i].offset = total_size;
			list_data[i].length = info.ListLength(i);
			total_size += list_data[i].length;
		}
	}

	// now construct the child vector of the list
	ListVector::Reserve(result, total_size);
	auto range_data = FlatVector::GetData<typename OP::TYPE>(ListVector::GetEntry(result));
	idx_t total_idx = 0;
	for (idx_t i = 0; i < args_size; i++) {
		typename OP::TYPE start_value = info.StartListValue(i);
		typename OP::INCREMENT_TYPE increment = info.ListIncrementValue(i);

		typename OP::TYPE range_value = start_value;
		for (idx_t range_idx = 0; range_idx < list_data[i].length; range_idx++) {
			if (range_idx > 0) {
				OP::Increment(range_value, increment);
			}
			range_data[total_idx++] = range_value;
		}
	}

	ListVector::SetListSize(result, total_size);
	result.SetVectorType(result_type);

	result.Verify(args.size());
}